

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_tree.cc
# Opt level: O0

uint32_t __thiscall IndexTree::allocateNode(IndexTree *this)

{
  int iVar1;
  void *pvVar2;
  int *in_RDI;
  int ret;
  undefined4 in_stack_fffffffffffffff0;
  
  if ((uint)in_RDI[4] <= **(uint **)(in_RDI + 8)) {
    iVar1 = ftruncate(*in_RDI,*(long *)(in_RDI + 2) << 1);
    if (iVar1 != 0) {
      __assert_fail("ret == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/engine_race/index_tree.cc"
                    ,0xe9,"uint32_t IndexTree::allocateNode()");
    }
    pvVar2 = mremap(*(void **)(in_RDI + 6),*(size_t *)(in_RDI + 2),*(long *)(in_RDI + 2) << 1,1);
    *(void **)(in_RDI + 6) = pvVar2;
    if (*(long *)(in_RDI + 6) == -1) {
      __assert_fail("file_map != MAP_FAILED",
                    "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/engine_race/index_tree.cc"
                    ,0xeb,"uint32_t IndexTree::allocateNode()");
    }
    *(long *)(in_RDI + 2) = *(long *)(in_RDI + 2) << 1;
    in_RDI[4] = SUB164(ZEXT416((int)*(undefined8 *)(in_RDI + 2) - 8) / ZEXT816(0x41c),0);
    initFileMap((IndexTree *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
  }
  **(int **)(in_RDI + 8) = **(int **)(in_RDI + 8) + 1;
  return **(int **)(in_RDI + 8) - 1;
}

Assistant:

uint32_t IndexTree::allocateNode() {
    if (__glibc_unlikely(*node_count >= current_capacity)) {
//        printf("Re-mapping index file to extend size\n");
        // extend the index file size
        int ret = ftruncate(index_file_fd, index_file_size * 2);
        assert(ret == 0);
        file_map = mremap(file_map, index_file_size, index_file_size * 2, MREMAP_MAYMOVE);
        assert(file_map != MAP_FAILED);
        index_file_size *= 2;
        current_capacity = (uint32_t) (index_file_size - 2 * sizeof(uint32_t)) / sizeof(Node);
        initFileMap();
    }
    *node_count += 1;
    return *node_count - 1;
}